

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O3

Vector3d * __thiscall
OpenMD::Molecule::getCom(Vector3d *__return_storage_ptr__,Molecule *this,int snapshotNo)

{
  double *pdVar1;
  double dVar2;
  StuntDouble *pSVar3;
  uint i;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  pointer ppSVar6;
  double dVar7;
  double local_68 [4];
  double local_48 [4];
  
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  ppSVar6 = (this->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  dVar7 = 0.0;
  if (ppSVar6 !=
      (this->integrableObjects_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar3 = *ppSVar6;
    while (pSVar3 != (StuntDouble *)0x0) {
      dVar2 = pSVar3->mass_;
      iVar4 = (*pSVar3->snapshotMan_->_vptr_SnapshotManager[4])
                        (pSVar3->snapshotMan_,(ulong)(uint)snapshotNo);
      lVar5 = *(long *)(CONCAT44(extraout_var,iVar4) + pSVar3->storage_);
      pdVar1 = (double *)(lVar5 + (long)pSVar3->localIndex_ * 0x18);
      local_48[0] = *pdVar1;
      local_48[1] = pdVar1[1];
      local_48[2] = (double)*(undefined8 *)(lVar5 + 0x10 + (long)pSVar3->localIndex_ * 0x18);
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      lVar5 = 0;
      do {
        local_68[lVar5] = local_48[lVar5] * dVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar5 = 0;
      do {
        (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar5] =
             local_68[lVar5] + (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      dVar7 = dVar7 + dVar2;
      ppSVar6 = ppSVar6 + 1;
      if (ppSVar6 ==
          (this->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      pSVar3 = *ppSVar6;
    }
  }
  lVar5 = 0;
  do {
    (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar5] =
         (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar5] / dVar7;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Molecule::getCom(int snapshotNo) {
    StuntDouble* sd;
    std::vector<StuntDouble*>::iterator i;
    Vector3d com {};
    RealType totalMass {};
    RealType mass {};

    for (sd = beginIntegrableObject(i); sd != NULL;
         sd = nextIntegrableObject(i)) {
      mass = sd->getMass();
      totalMass += mass;
      com += sd->getPos(snapshotNo) * mass;
    }

    com /= totalMass;

    return com;
  }